

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *state,ZydisDecodedInstruction *instruction)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  ZyanBool ZVar25;
  ZydisDefinitionAccessedFlags *pZStack_60;
  ZyanStatus status_047620348_3;
  ZydisDefinitionAccessedFlags *flags;
  ZyanStatus local_50;
  ZyanStatus status_047620348_2;
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZydisInstructionEncodingInfo *info;
  ZydisInstructionDefinition *definition;
  ZyanStatus status;
  ZyanU16 index;
  ZydisDecoderTreeNodeType node_type;
  ZydisDecoderTreeNode *temp;
  ZydisDecoderTreeNode *node;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderState *state_local;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined3 uVar13;
  undefined3 uVar14;
  undefined3 uVar15;
  undefined2 uVar19;
  undefined2 uVar20;
  undefined2 uVar21;
  
  node = (ZydisDecoderTreeNode *)instruction;
  instruction_local = (ZydisDecodedInstruction *)state;
  if (state == (ZydisDecoderState *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x1248,
                  "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x1249,
                  "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  temp = ZydisDecoderTreeGetRootNode();
  _status = (ZydisDecoderTreeNode *)0x0;
  do {
    definition._7_1_ = temp->type;
    definition._4_2_ = 0;
    definition._0_4_ = 0;
    switch(definition._7_1_) {
    case 0:
      if (_status == (ZydisDecoderTreeNode *)0x0) {
        return 0x80200001;
      }
      temp = _status;
      _status = (ZydisDecoderTreeNode *)0x0;
      definition._7_1_ = 0xc;
      if (*(char *)((long)&instruction_local->attributes + 4) != '\0') {
        *(undefined4 *)
         ((long)node + (ulong)*(byte *)((long)&instruction_local->cpu_flags + 3) * 8 + 0x74) = 0;
      }
      if (*(char *)((long)&instruction_local->attributes + 4) == 'f') {
        if (*(char *)&instruction_local->cpu_flags ==
            *(char *)((long)&instruction_local->cpu_flags + 3)) {
          *(undefined4 *)
           ((long)node + (ulong)*(byte *)((long)&instruction_local->cpu_flags + 3) * 8 + 0x74) = 1;
        }
        *(ulong *)((long)&node[10].value + 1) =
             *(ulong *)((long)&node[10].value + 1) | 0x80000000000;
      }
      goto LAB_0010fa4b;
    case 1:
      definition._0_4_ =
           ZydisNodeHandlerXOP((ZydisDecodedInstruction *)node,(ZyanU16 *)((long)&definition + 4));
      break;
    case 2:
      definition._0_4_ =
           ZydisNodeHandlerVEX((ZydisDecodedInstruction *)node,(ZyanU16 *)((long)&definition + 4));
      break;
    case 3:
      definition._0_4_ =
           ZydisNodeHandlerEMVEX((ZydisDecodedInstruction *)node,(ZyanU16 *)((long)&definition + 4))
      ;
      break;
    case 4:
      definition._0_4_ =
           ZydisNodeHandlerOpcode
                     ((ZydisDecoderState *)instruction_local,(ZydisDecodedInstruction *)node,
                      (ZyanU16 *)((long)&definition + 4));
      break;
    case 5:
      definition._0_4_ =
           ZydisNodeHandlerMode((ZydisDecodedInstruction *)node,(ZyanU16 *)((long)&definition + 4));
      break;
    case 6:
      definition._0_4_ =
           ZydisNodeHandlerModeCompact
                     ((ZydisDecodedInstruction *)node,(ZyanU16 *)((long)&definition + 4));
      break;
    case 7:
      definition._0_4_ =
           ZydisNodeHandlerModrmMod
                     ((ZydisDecoderState *)instruction_local,(ZydisDecodedInstruction *)node,
                      (ZyanU16 *)((long)&definition + 4));
      break;
    case 8:
      definition._0_4_ =
           ZydisNodeHandlerModrmModCompact
                     ((ZydisDecoderState *)instruction_local,(ZydisDecodedInstruction *)node,
                      (ZyanU16 *)((long)&definition + 4));
      break;
    case 9:
      definition._0_4_ =
           ZydisNodeHandlerModrmReg
                     ((ZydisDecoderState *)instruction_local,(ZydisDecodedInstruction *)node,
                      (ZyanU16 *)((long)&definition + 4));
      break;
    case 10:
      definition._0_4_ =
           ZydisNodeHandlerModrmRm
                     ((ZydisDecoderState *)instruction_local,(ZydisDecodedInstruction *)node,
                      (ZyanU16 *)((long)&definition + 4));
      break;
    case 0xb:
      definition._4_2_ = (ushort)(*(char *)((long)&instruction_local->attributes + 1) != '\0');
      break;
    case 0xc:
      definition._0_4_ =
           ZydisNodeHandlerMandatoryPrefix
                     ((ZydisDecoderState *)instruction_local,(ZydisDecodedInstruction *)node,
                      (ZyanU16 *)((long)&definition + 4));
      _status = ZydisDecoderTreeGetChildNode(temp,0);
      break;
    case 0xd:
      definition._0_4_ =
           ZydisNodeHandlerOperandSize
                     ((ZydisDecoderState *)instruction_local,(ZydisDecodedInstruction *)node,
                      (ZyanU16 *)((long)&definition + 4));
      break;
    case 0xe:
      definition._0_4_ =
           ZydisNodeHandlerAddressSize
                     ((ZydisDecodedInstruction *)node,(ZyanU16 *)((long)&definition + 4));
      break;
    case 0xf:
      definition._0_4_ =
           ZydisNodeHandlerVectorLength
                     (*(ZydisDecoderContext **)&instruction_local->length,
                      (ZydisDecodedInstruction *)node,(ZyanU16 *)((long)&definition + 4));
      break;
    case 0x10:
      definition._0_4_ =
           ZydisNodeHandlerRexW
                     (*(ZydisDecoderContext **)&instruction_local->length,
                      (ZydisDecodedInstruction *)node,(ZyanU16 *)((long)&definition + 4));
      break;
    case 0x11:
      definition._0_4_ =
           ZydisNodeHandlerRexB
                     (*(ZydisDecoderContext **)&instruction_local->length,
                      (ZydisDecodedInstruction *)node,(ZyanU16 *)((long)&definition + 4));
      break;
    case 0x12:
      definition._0_4_ =
           ZydisNodeHandlerEvexB((ZydisDecodedInstruction *)node,(ZyanU16 *)((long)&definition + 4))
      ;
      break;
    case 0x13:
      definition._0_4_ =
           ZydisNodeHandlerMvexE((ZydisDecodedInstruction *)node,(ZyanU16 *)((long)&definition + 4))
      ;
      break;
    case 0x14:
      definition._4_2_ = (ushort)((*(uint *)(*(long *)instruction_local + 8) & 2) != 0);
      break;
    case 0x15:
      definition._4_2_ = (ushort)((*(uint *)(*(long *)instruction_local + 8) & 4) != 0);
      break;
    case 0x16:
      definition._4_2_ = (ushort)((*(uint *)(*(long *)instruction_local + 8) & 8) != 0);
      break;
    case 0x17:
      definition._4_2_ = (ushort)((*(uint *)(*(long *)instruction_local + 8) & 0x10) != 0);
      break;
    case 0x18:
      definition._4_2_ = (ushort)((*(uint *)(*(long *)instruction_local + 8) & 0x20) != 0);
      break;
    case 0x19:
      definition._4_2_ = (ushort)((*(uint *)(*(long *)instruction_local + 8) & 0x40) != 0);
      break;
    case 0x1a:
      definition._4_2_ = (ushort)((*(uint *)(*(long *)instruction_local + 8) & 0x80) != 0);
      break;
    case 0x1b:
      definition._4_2_ = (ushort)((*(uint *)(*(long *)instruction_local + 8) & 0x100) != 0);
      break;
    case 0x1c:
      definition._4_2_ = (ushort)((*(uint *)(*(long *)instruction_local + 8) & 0x200) != 0);
      break;
    case 0x1d:
      definition._4_2_ = (ushort)((*(uint *)(*(long *)instruction_local + 8) & 0x400) != 0);
      break;
    default:
      if ((definition._7_1_ & 0x80) == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x131c,
                      "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                     );
      }
      ZydisGetInstructionDefinition
                (*(ZydisInstructionEncoding *)(node + 4),temp->value,
                 (ZydisInstructionDefinition **)&info);
      ZydisSetEffectiveOperandWidth
                (*(ZydisDecoderContext **)&instruction_local->length,(ZydisDecodedInstruction *)node
                 ,(ZydisInstructionDefinition *)info);
      ZydisSetEffectiveAddressWidth
                (*(ZydisDecoderContext **)&instruction_local->length,(ZydisDecodedInstruction *)node
                 ,(ZydisInstructionDefinition *)info);
      ZydisGetInstructionEncodingInfo(temp,(ZydisInstructionEncodingInfo **)&status_047620348_1);
      status_047620348_2 =
           ZydisDecodeOptionalInstructionParts
                     ((ZydisDecoderState *)instruction_local,(ZydisDecodedInstruction *)node,
                      _status_047620348_1);
      if ((status_047620348_2 & 0x80000000) != 0) {
        return status_047620348_2;
      }
      local_50 = ZydisCheckErrorConditions
                           ((ZydisDecoderState *)instruction_local,(ZydisDecodedInstruction *)node,
                            (ZydisInstructionDefinition *)info);
      if ((local_50 & 0x80000000) != 0) {
        return local_50;
      }
      if (*(int *)(node + 4) == 1) {
        flags._4_4_ = ZydisInputNext((ZydisDecoderState *)instruction_local,
                                     (ZydisDecodedInstruction *)node,
                                     (ZyanU8 *)((long)&node[6].value + 1));
        if ((flags._4_4_ & 0x80000000) != 0) {
          return flags._4_4_;
        }
        temp = ZydisDecoderTreeGetRootNode();
        temp = ZydisDecoderTreeGetChildNode(temp,0xf);
        temp = ZydisDecoderTreeGetChildNode(temp,0xf);
        temp = ZydisDecoderTreeGetChildNode(temp,(ushort)*(byte *)((long)&node[6].value + 1));
        if (temp->type == '\0') {
          return 0x80200001;
        }
        if (temp->type != '\b') {
          __assert_fail("node->type == ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x12e6,
                        "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                       );
        }
        temp = ZydisDecoderTreeGetChildNode(temp,(ushort)(node[0x55].type != '\x03'));
        if ((temp->type & 0x80) == 0) {
          __assert_fail("node->type & ZYDIS_NODETYPE_DEFINITION_MASK",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x12e9,
                        "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                       );
        }
        ZydisGetInstructionDefinition
                  (*(ZydisInstructionEncoding *)(node + 4),temp->value,
                   (ZydisInstructionDefinition **)&info);
      }
      uVar1._0_1_ = info->flags;
      uVar1._1_3_ = info->disp;
      *(uint *)&node[1].value = uVar1 & 0x7ff;
      uVar2._0_1_ = info->flags;
      uVar2._1_3_ = info->disp;
      node[8].type = (byte)(uVar2 >> 0xb) & 0xf;
      uVar3._0_1_ = info->flags;
      uVar3._1_3_ = info->disp;
      *(byte *)&node[8].value = (byte)(uVar3 >> 0xf) & 7;
      **(undefined8 **)&instruction_local->length = info;
      uVar4 = info->imm[0].size[0];
      uVar10 = info->imm[0].size[1];
      uVar16 = info->imm[0].size[2];
      uVar22 = info->imm[0].is_signed;
      uVar19 = CONCAT11(uVar22,uVar16);
      uVar13 = CONCAT21(uVar19,uVar10);
      uVar7 = CONCAT31(uVar13,uVar4);
      *(uint *)((long)&node[0x1e].value + 1) = (uint)uVar7 >> 0xf & 0x7f;
      uVar5 = info->imm[0].size[0];
      uVar11 = info->imm[0].size[1];
      uVar17 = info->imm[0].size[2];
      uVar23 = info->imm[0].is_signed;
      uVar20 = CONCAT11(uVar23,uVar17);
      uVar14 = CONCAT21(uVar20,uVar11);
      uVar8 = CONCAT31(uVar14,uVar5);
      *(uint *)(node + 0x20) = (uint)uVar8 >> 0x16 & 0xff;
      uVar6 = info->imm[0].size[0];
      uVar12 = info->imm[0].size[1];
      uVar18 = info->imm[0].size[2];
      uVar24 = info->imm[0].is_signed;
      uVar21 = CONCAT11(uVar24,uVar18);
      uVar15 = CONCAT21(uVar21,uVar12);
      uVar9 = CONCAT31(uVar15,uVar6);
      *(uint *)&node[0x21].value =
           ((uint)uVar9 >> 0x1e) + *(int *)&info->imm[0].is_relative * 4 & 0x7f;
      *(uint *)((long)&node[0x22].value + 1) = (uint)(info->imm[0].is_relative >> 5 & 3);
      if ((((*(int *)((long)&node[0x22].value + 1) != 0) &&
           (*(int *)((long)&node[0x1e].value + 1) != 0x15)) &&
          (*(int *)((long)&node[0x1e].value + 1) != 0x1d)) &&
         ((*(int *)((long)&node[0x1e].value + 1) != 0x67 &&
          (*(int *)((long)&node[0x1e].value + 1) != 0x51)))) {
        __assert_fail("(instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_NONE) || ((instruction->meta.category == ZYDIS_CATEGORY_CALL) || (instruction->meta.category == ZYDIS_CATEGORY_COND_BR) || (instruction->meta.category == ZYDIS_CATEGORY_UNCOND_BR) || (instruction->meta.category == ZYDIS_CATEGORY_RET))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x12fd,
                      "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                     );
      }
      *(uint *)(node + 0x24) = (uint)((byte)(*(uint *)&info->imm[0].is_relative >> 7) & 0x3f);
      if ((*(uint *)(*(long *)instruction_local + 8) & 1) == 0) {
        ZydisSetAttributes((ZydisDecoderState *)instruction_local,(ZydisDecodedInstruction *)node,
                           (ZydisInstructionDefinition *)info);
        if (*(int *)(node + 4) - 2U < 4) {
          ZydisSetAVXInformation
                    (*(ZydisDecoderContext **)&instruction_local->length,
                     (ZydisDecodedInstruction *)node,(ZydisInstructionDefinition *)info);
        }
        ZVar25 = ZydisGetAccessedFlags((ZydisInstructionDefinition *)info,&stack0xffffffffffffffa0);
        if (ZVar25 != '\0') {
          *(ulong *)((long)&node[10].value + 1) = *(ulong *)((long)&node[10].value + 1) | 0x200;
        }
        *(ZydisDefinitionAccessedFlags **)&node[0xd].value = pZStack_60;
        *(ZydisAccessedFlags **)(node + 0x10) = &pZStack_60->fpu_flags;
      }
      return 0x100000;
    }
    if (((ZyanStatus)definition & 0x80000000) != 0) {
      return (ZyanStatus)definition;
    }
    temp = ZydisDecoderTreeGetChildNode(temp,definition._4_2_);
LAB_0010fa4b:
    if (definition._7_1_ == 0 || (definition._7_1_ & 0x80) != 0) {
      return 0x100000;
    }
  } while( true );
}

Assistant:

static ZyanStatus ZydisDecodeInstruction(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);

    // Iterate through the decoder tree
    const ZydisDecoderTreeNode* node = ZydisDecoderTreeGetRootNode();
    const ZydisDecoderTreeNode* temp = ZYAN_NULL;
    ZydisDecoderTreeNodeType node_type;
    do
    {
        node_type = node->type;
        ZyanU16 index = 0;
        ZyanStatus status = 0;
        switch (node_type)
        {
        case ZYDIS_NODETYPE_INVALID:
            if (temp)
            {
                node = temp;
                temp = ZYAN_NULL;
                node_type = ZYDIS_NODETYPE_FILTER_MANDATORY_PREFIX;
                if (state->prefixes.mandatory_candidate != 0x00)
                {
                    instruction->raw.prefixes[state->prefixes.offset_mandatory].type =
                        ZYDIS_PREFIX_TYPE_IGNORED;
                }
                if (state->prefixes.mandatory_candidate == 0x66)
                {
                    if (state->prefixes.offset_osz_override ==
                        state->prefixes.offset_mandatory)
                    {
                        instruction->raw.prefixes[state->prefixes.offset_mandatory].type =
                            ZYDIS_PREFIX_TYPE_EFFECTIVE;
                    }
                    instruction->attributes |= ZYDIS_ATTRIB_HAS_OPERANDSIZE;
                }
                continue;
            }
            return ZYDIS_STATUS_DECODING_ERROR;
        case ZYDIS_NODETYPE_FILTER_XOP:
            status = ZydisNodeHandlerXOP(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_VEX:
            status = ZydisNodeHandlerVEX(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_EMVEX:
            status = ZydisNodeHandlerEMVEX(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_OPCODE:
            status = ZydisNodeHandlerOpcode(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODE:
            status = ZydisNodeHandlerMode(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_COMPACT:
            status = ZydisNodeHandlerModeCompact(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_MOD:
            status = ZydisNodeHandlerModrmMod(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT:
            status = ZydisNodeHandlerModrmModCompact(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_REG:
            status = ZydisNodeHandlerModrmReg(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_RM:
            status = ZydisNodeHandlerModrmRm(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_PREFIX_GROUP1:
            index = state->prefixes.group1 ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MANDATORY_PREFIX:
            status = ZydisNodeHandlerMandatoryPrefix(state, instruction, &index);
            temp = ZydisDecoderTreeGetChildNode(node, 0);
            // TODO: Return to this point, if index == 0 contains a value and the previous path
            // TODO: was not successful
            // TODO: Restore consumed prefix
            break;
        case ZYDIS_NODETYPE_FILTER_OPERAND_SIZE:
            status = ZydisNodeHandlerOperandSize(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_ADDRESS_SIZE:
            status = ZydisNodeHandlerAddressSize(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_VECTOR_LENGTH:
            status = ZydisNodeHandlerVectorLength(state->context, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_REX_W:
            status = ZydisNodeHandlerRexW(state->context, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_REX_B:
            status = ZydisNodeHandlerRexB(state->context, instruction, &index);
            break;
#ifndef ZYDIS_DISABLE_AVX512
        case ZYDIS_NODETYPE_FILTER_EVEX_B:
            status = ZydisNodeHandlerEvexB(instruction, &index);
            break;
#endif
#ifndef ZYDIS_DISABLE_KNC
        case ZYDIS_NODETYPE_FILTER_MVEX_E:
            status = ZydisNodeHandlerMvexE(instruction, &index);
            break;
#endif
        case ZYDIS_NODETYPE_FILTER_MODE_AMD:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_AMD_BRANCHES));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_KNC:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_KNC));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_MPX:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_MPX));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_CET:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_CET));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_LZCNT:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_LZCNT));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_TZCNT:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_TZCNT));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_WBNOINVD:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_WBNOINVD));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_CLDEMOTE:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_CLDEMOTE));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_IPREFETCH:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_IPREFETCH));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_UD0_COMPAT:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_UD0_COMPAT));
            break;
        default:
            if (node_type & ZYDIS_NODETYPE_DEFINITION_MASK)
            {
                const ZydisInstructionDefinition* definition;
                ZydisGetInstructionDefinition(instruction->encoding, node->value, &definition);
                ZydisSetEffectiveOperandWidth(state->context, instruction, definition);
                ZydisSetEffectiveAddressWidth(state->context, instruction, definition);

                const ZydisInstructionEncodingInfo* info;
                ZydisGetInstructionEncodingInfo(node, &info);
                ZYAN_CHECK(ZydisDecodeOptionalInstructionParts(state, instruction, info));
                ZYAN_CHECK(ZydisCheckErrorConditions(state, instruction, definition));

                if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_3DNOW)
                {
                    // Get actual 3DNOW opcode and definition
                    ZYAN_CHECK(ZydisInputNext(state, instruction, &instruction->opcode));
                    node = ZydisDecoderTreeGetRootNode();
                    node = ZydisDecoderTreeGetChildNode(node, 0x0F);
                    node = ZydisDecoderTreeGetChildNode(node, 0x0F);
                    node = ZydisDecoderTreeGetChildNode(node, instruction->opcode);
                    if (node->type == ZYDIS_NODETYPE_INVALID)
                    {
                        return ZYDIS_STATUS_DECODING_ERROR;
                    }
                    ZYAN_ASSERT(node->type == ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT);
                    node = ZydisDecoderTreeGetChildNode(
                        node, (instruction->raw.modrm.mod == 0x3) ? 0 : 1);
                    ZYAN_ASSERT(node->type & ZYDIS_NODETYPE_DEFINITION_MASK);
                    ZydisGetInstructionDefinition(instruction->encoding, node->value, &definition);
                }

                instruction->mnemonic = definition->mnemonic;

#ifndef ZYDIS_MINIMAL_MODE

                instruction->operand_count = definition->operand_count;
                instruction->operand_count_visible = definition->operand_count_visible;
                state->context->definition = definition;

                instruction->meta.category = definition->category;
                instruction->meta.isa_set = definition->isa_set;
                instruction->meta.isa_ext = definition->isa_ext;
                instruction->meta.branch_type = definition->branch_type;
                ZYAN_ASSERT((instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_NONE) ||
                        ((instruction->meta.category == ZYDIS_CATEGORY_CALL) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_COND_BR) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_UNCOND_BR) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_RET)));
                instruction->meta.exception_class = definition->exception_class;

                if (!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_MINIMAL)))
                {
                    ZydisSetAttributes(state, instruction, definition);
                    switch (instruction->encoding)
                    {
                    case ZYDIS_INSTRUCTION_ENCODING_XOP:
                    case ZYDIS_INSTRUCTION_ENCODING_VEX:
                    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
                    case ZYDIS_INSTRUCTION_ENCODING_MVEX:
                        ZydisSetAVXInformation(state->context, instruction, definition);
                        break;
                    default:
                        break;
                    }

                    const ZydisDefinitionAccessedFlags* flags;
                    if (ZydisGetAccessedFlags(definition, &flags))
                    {
                        instruction->attributes |= ZYDIS_ATTRIB_CPUFLAG_ACCESS;
                    }
                    instruction->cpu_flags = &flags->cpu_flags;
                    instruction->fpu_flags = &flags->fpu_flags;
                }

#endif

                return ZYAN_STATUS_SUCCESS;
            }
            ZYAN_UNREACHABLE;
        }
        ZYAN_CHECK(status);
        node = ZydisDecoderTreeGetChildNode(node, index);
    } while ((node_type != ZYDIS_NODETYPE_INVALID) && !(node_type & ZYDIS_NODETYPE_DEFINITION_MASK));
    return ZYAN_STATUS_SUCCESS;
}